

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O2

void Res_SimCollectPatterns(Res_Sim_t *p,int fVerbose)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  int iVar8;
  
  pVVar2 = p->vPats;
  pAVar3 = Abc_NtkPo(p->pAig,0);
  pvVar4 = Vec_PtrEntry(pVVar2,pAVar3->Id);
  pVVar2 = p->vPats;
  pAVar3 = Abc_NtkPo(p->pAig,1);
  pvVar5 = Vec_PtrEntry(pVVar2,pAVar3->Id);
  for (lVar7 = 0; lVar7 < p->nBytesIn; lVar7 = lVar7 + 1) {
    if (*(char *)((long)pvVar4 + lVar7) != '\0') {
      if (*(char *)((long)pvVar5 + lVar7) == '\0') {
        if (p->nPats0 < p->nPats) {
          iVar8 = 0;
          while( true ) {
            if (p->pAig->vPis->nSize <= iVar8) break;
            pAVar3 = Abc_NtkPi(p->pAig,iVar8);
            if (iVar8 == p->nTruePis) break;
            pvVar6 = Vec_PtrEntry(p->vPats,pAVar3->Id);
            if (*(char *)((long)pvVar6 + lVar7) != '\0') {
              if (*(char *)((long)pvVar6 + lVar7) != -1) {
                __assert_fail("pInfo[i] == 0 || pInfo[i] == 0xff",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                              ,0x287,"void Res_SimCollectPatterns(Res_Sim_t *, int)");
              }
              pvVar6 = Vec_PtrEntry(p->vPats0,iVar8);
              puVar1 = (uint *)((long)pvVar6 + (long)(p->nPats0 >> 5) * 4);
              *puVar1 = *puVar1 | 1 << ((byte)p->nPats0 & 0x1f);
            }
            iVar8 = iVar8 + 1;
          }
          iVar8 = p->nPats0 + 1;
          p->nPats0 = iVar8;
          goto LAB_003cacf1;
        }
      }
      else {
        if (*(char *)((long)pvVar5 + lVar7) != -1) {
          __assert_fail("pInfoNode[i] == 0 || pInfoNode[i] == 0xff",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                        ,0x27d,"void Res_SimCollectPatterns(Res_Sim_t *, int)");
        }
        if (p->nPats1 < p->nPats) {
          iVar8 = 0;
          while( true ) {
            if (p->pAig->vPis->nSize <= iVar8) break;
            pAVar3 = Abc_NtkPi(p->pAig,iVar8);
            if (iVar8 == p->nTruePis) break;
            pvVar6 = Vec_PtrEntry(p->vPats,pAVar3->Id);
            if (*(char *)((long)pvVar6 + lVar7) != '\0') {
              if (*(char *)((long)pvVar6 + lVar7) != -1) {
                __assert_fail("pInfo[i] == 0 || pInfo[i] == 0xff",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                              ,0x296,"void Res_SimCollectPatterns(Res_Sim_t *, int)");
              }
              pvVar6 = Vec_PtrEntry(p->vPats1,iVar8);
              puVar1 = (uint *)((long)pvVar6 + (long)(p->nPats1 >> 5) * 4);
              *puVar1 = *puVar1 | 1 << ((byte)p->nPats1 & 0x1f);
            }
            iVar8 = iVar8 + 1;
          }
          p->nPats1 = p->nPats1 + 1;
          iVar8 = p->nPats0;
LAB_003cacf1:
          if ((p->nPats <= iVar8) && (p->nPats <= p->nPats1)) break;
        }
      }
    }
  }
  if (fVerbose != 0) {
    printf("|  ");
    printf("On = %3d  ",(ulong)(uint)p->nPats1);
    printf("Off = %3d  ",(ulong)(uint)p->nPats0);
    putchar(10);
    return;
  }
  return;
}

Assistant:

void Res_SimCollectPatterns( Res_Sim_t * p, int fVerbose )
{
    Abc_Obj_t * pObj;
    unsigned char * pInfoCare, * pInfoNode, * pInfo;
    int i, j;
    pInfoCare = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 0)->Id );
    pInfoNode = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 1)->Id );
    for ( i = 0; i < p->nBytesIn; i++ )
    {
        // skip don't-care patterns
        if ( !pInfoCare[i] )
            continue;
        // separate offset and onset patterns
        assert( pInfoNode[i] == 0 || pInfoNode[i] == 0xff );
        if ( !pInfoNode[i] )
        {
            if ( p->nPats0 >= p->nPats )
                continue;
            Abc_NtkForEachPi( p->pAig, pObj, j )
            {
                if ( j == p->nTruePis )
                    break;
                pInfo = (unsigned char *)Vec_PtrEntry( p->vPats, pObj->Id );
                assert( pInfo[i] == 0 || pInfo[i] == 0xff );
                if ( pInfo[i] )
                    Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vPats0, j), p->nPats0 );
            }
            p->nPats0++;
        }
        else
        {
            if ( p->nPats1 >= p->nPats )
                continue;
            Abc_NtkForEachPi( p->pAig, pObj, j )
            {
                if ( j == p->nTruePis )
                    break;
                pInfo = (unsigned char *)Vec_PtrEntry( p->vPats, pObj->Id );
                assert( pInfo[i] == 0 || pInfo[i] == 0xff );
                if ( pInfo[i] )
                    Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vPats1, j), p->nPats1 );
            }
            p->nPats1++;
        }
        if ( p->nPats0 >= p->nPats && p->nPats1 >= p->nPats )
            break;
    }
    if ( fVerbose )
    {
        printf( "|  " );
        printf( "On = %3d  ", p->nPats1 );
        printf( "Off = %3d  ", p->nPats0 );
        printf( "\n" );
    }
}